

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_26896::file_output::calculate_checksum(file_output *this)

{
  size_t size;
  long lVar1;
  logger *plVar2;
  bool bVar3;
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  char buffer [8192];
  logger local_2038 [21];
  
  uVar4 = this->checksum_position_;
  bVar3 = true;
  if (uVar4 != ((this->file_->super_processed_item<setup::file_entry>).entry_)->size) {
    if (this->write_ == true) {
      uVar6 = 0x1fffffffffffffff;
      if (uVar4 < 0x1fffffffffffffff) {
        uVar6 = uVar4;
      }
      while( true ) {
        std::istream::seekg((long)&this->stream_,(_Ios_Seekdir)uVar6);
        uVar4 = uVar4 - uVar6;
        if (uVar4 == 0) break;
        uVar6 = 0x1fffffffffffffff;
        if (uVar4 < 0x1fffffffffffffff) {
          uVar6 = uVar4;
        }
      }
      if (((&(this->stream_).super_basic_fstream<char,_std::char_traits<char>_>.field_0x20)
           [*(long *)(*(long *)&(this->stream_).super_basic_fstream<char,_std::char_traits<char>_> +
                     -0x18)] & 2) == 0) {
        do {
          lVar1 = std::istream::read((char *)&this->stream_,(long)local_2038);
          size = *(size_t *)(lVar1 + 8);
          crypto::hasher::update(&this->checksum_,(char *)local_2038,size);
          uVar5 = size + this->checksum_position_;
          this->checksum_position_ = uVar5;
        } while (((&(this->stream_).super_basic_fstream<char,_std::char_traits<char>_>.field_0x20)
                  [*(long *)(*(long *)&(this->stream_).
                                       super_basic_fstream<char,_std::char_traits<char>_> + -0x18)]
                 & 2) == 0);
      }
      else {
        uVar5 = this->checksum_position_;
      }
      if (uVar5 == ((this->file_->super_processed_item<setup::file_entry>).entry_)->size) {
        return true;
      }
      local_2038[0].level = Warning;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2038[0].buffer);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2038[0].buffer,"Could not read back ",0x14);
      plVar2 = logger::operator<<(local_2038,&this->path_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&plVar2->buffer," to calculate output checksum for multi-part file",0x31
                );
      logger::~logger(local_2038);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool calculate_checksum() {
		
		if(has_checksum()) {
			return true;
		}
		
		if(!write_) {
			return false;
		}
		
		debug("calculating output checksum for " << path_);
		
		const boost::uint64_t max = boost::uint64_t(std::numeric_limits<util::fstream::off_type>::max() / 4);
		
		boost::uint64_t diff = checksum_position_;
		stream_.seekg(util::fstream::off_type(std::min(diff, max)), std::ios_base::beg);
		diff -= std::min(diff, max);
		while(diff > 0) {
			stream_.seekg(util::fstream::off_type(std::min(diff, max)), std::ios_base::cur);
			diff -= std::min(diff, max);
		}
		
		while(!stream_.eof()) {
			char buffer[8192];
			std::streamsize n = stream_.read(buffer, sizeof(buffer)).gcount();
			checksum_.update(buffer, size_t(n));
			checksum_position_ += boost::uint64_t(n);
		}
		
		if(!has_checksum()) {
			log_warning << "Could not read back " << path_ << " to calculate output checksum for multi-part file";
			return false;
		}
		
		return true;
	}